

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZROT::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZROT *this,
          ChVector<double> *abs_point)

{
  double dVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ChVector<double> *v;
  bool is_into;
  double s3;
  double s2;
  ChVector<double> local_58;
  undefined1 local_38 [16];
  double local_28;
  
  local_58.m_data[0] = abs_point->m_data[0];
  local_58.m_data[1] = abs_point->m_data[1];
  local_58.m_data[2] = abs_point->m_data[2];
  local_28 = 0.0;
  local_38 = ZEXT816(0) << 0x20;
  collision::utils::PointTriangleDistance
            (&local_58,
             (ChVector<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,&s2,&s3,&is_into,(ChVector<double> *)local_38);
  peVar4 = (this->mnode2).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5 = (this->mnode1).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar6 = (this->mnode3).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar1 = *(double *)&peVar4->field_0xb0;
  dVar8 = *(double *)&peVar4->field_0xa8;
  dVar7 = (1.0 - s2) - s3;
  dVar2 = *(double *)&peVar5->field_0xb0;
  dVar9 = *(double *)&peVar5->field_0xa8;
  dVar3 = *(double *)&peVar6->field_0xb0;
  dVar10 = *(double *)&peVar6->field_0xa8;
  __return_storage_ptr__->m_data[0] =
       dVar7 * *(double *)&peVar5->field_0xa0 + s2 * *(double *)&peVar4->field_0xa0 +
       s3 * *(double *)&peVar6->field_0xa0;
  __return_storage_ptr__->m_data[1] = dVar7 * dVar9 + s2 * dVar8 + s3 * dVar10;
  __return_storage_ptr__->m_data[2] = dVar7 * dVar2 + s2 * dVar1 + s3 * dVar3;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactTriangleXYZROT::GetContactPointSpeed(const ChVector<>& abs_point) {
    double s2, s3;
    ComputeUVfromP(abs_point, s2, s3);
    double s1 = 1 - s2 - s3;
    return (s1 * mnode1->GetPos_dt() + s2 * mnode2->GetPos_dt() + s3 * mnode3->GetPos_dt());
}